

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::new_line
          (basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *this,
          size_t len)

{
  long lVar1;
  stream_sink<char> *this_00;
  char *in_RSI;
  char *s;
  long in_RDI;
  size_t i;
  basic_json_encode_options<char> *in_stack_ffffffffffffff68;
  stream_sink<char> *this_01;
  char *local_68;
  string local_50 [32];
  char *local_10;
  
  lVar1 = in_RDI + 8;
  s = (char *)(in_RDI + 0x40);
  this_01 = (stream_sink<char> *)&stack0xffffffffffffffd0;
  local_10 = in_RSI;
  basic_json_encode_options<char>::new_line_chars_abi_cxx11_(in_stack_ffffffffffffff68);
  this_00 = (stream_sink<char> *)std::__cxx11::string::data();
  basic_json_encode_options<char>::new_line_chars_abi_cxx11_(in_stack_ffffffffffffff68);
  std::__cxx11::string::length();
  stream_sink<char>::append(this_00,s,(size_t)this_01);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  for (local_68 = (char *)0x0; local_68 < local_10; local_68 = local_68 + 1) {
    stream_sink<char>::push_back(this_01,(char)((ulong)lVar1 >> 0x38));
  }
  *(char **)(in_RDI + 0x1a8) = local_10;
  return;
}

Assistant:

void new_line(std::size_t len)
        {
            sink_.append(options_.new_line_chars().data(),options_.new_line_chars().length());
            for (std::size_t i = 0; i < len; ++i)
            {
                sink_.push_back(' ');
            }
            column_ = len;
        }